

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatterATT.c
# Opt level: O1

ZyanStatus
ZydisFormatterATTPrintMnemonic
          (ZydisFormatter *formatter,ZydisFormatterBuffer *buffer,ZydisFormatterContext *context)

{
  void **ppvVar1;
  int iVar2;
  ZydisBranchType ZVar3;
  ZydisDecodedOperand *pZVar4;
  ZyanUSize ZVar5;
  void *pvVar6;
  bool bVar7;
  ZyanStatus ZVar8;
  ZyanU32 ZVar9;
  ZydisShortString *pZVar10;
  ZydisLetterCase letter_case;
  ulong uVar11;
  ZyanUSize ZVar12;
  long lVar13;
  
  if (formatter == (ZydisFormatter *)0x0) {
    __assert_fail("formatter",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterATT.c"
                  ,0x115,
                  "ZyanStatus ZydisFormatterATTPrintMnemonic(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (buffer == (ZydisFormatterBuffer *)0x0) {
    __assert_fail("buffer",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterATT.c"
                  ,0x116,
                  "ZyanStatus ZydisFormatterATTPrintMnemonic(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (context == (ZydisFormatterContext *)0x0) {
    __assert_fail("context",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterATT.c"
                  ,0x117,
                  "ZyanStatus ZydisFormatterATTPrintMnemonic(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (context->instruction == (ZydisDecodedInstruction *)0x0) {
    __assert_fail("context->instruction",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterATT.c"
                  ,0x118,
                  "ZyanStatus ZydisFormatterATTPrintMnemonic(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (context->operands == (ZydisDecodedOperand *)0x0) {
    __assert_fail("context->operands",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterATT.c"
                  ,0x119,
                  "ZyanStatus ZydisFormatterATTPrintMnemonic(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  pZVar10 = ZydisMnemonicGetStringWrapped(context->instruction->mnemonic);
  if (pZVar10 == (ZydisShortString *)0x0) {
    if (buffer->is_token_list == '\0') {
      ZVar8 = ZydisStringAppendShortCase
                        (&buffer->string,&STR_INVALID_MNEMONIC,formatter->case_mnemonic);
      if (-1 < (int)ZVar8) {
        return 0x100000;
      }
      return ZVar8;
    }
    ZVar5 = (buffer->string).vector.size;
    if (ZVar5 - 1 < 0xff) {
      uVar11 = buffer->capacity;
      ZVar8 = 0x80100009;
      if (ZVar5 + 10 < uVar11) {
        pvVar6 = (buffer->string).vector.data;
        *(char *)((long)pvVar6 + -1) = (char)ZVar5;
        *(undefined8 *)((long)pvVar6 + ZVar5) = 0x696c61766e690006;
        *(undefined2 *)((long)pvVar6 + ZVar5 + 8) = 100;
        ZVar12 = buffer->capacity - (ZVar5 + 2);
        buffer->capacity = ZVar12;
        ppvVar1 = &(buffer->string).vector.data;
        *ppvVar1 = (void *)((long)*ppvVar1 + ZVar5 + 2);
        (buffer->string).vector.size = 8;
        if (0xfe < ZVar12) {
          ZVar12 = 0xff;
        }
        (buffer->string).vector.capacity = ZVar12;
        ZVar8 = 0x100000;
      }
      if (ZVar5 + 10 < uVar11) {
        return 0x100000;
      }
      return ZVar8;
    }
    __assert_fail("(len > 0) && (len < 256)",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/FormatterBase.h"
                  ,0xe7,
                  "ZyanStatus ZydisFormatterBufferAppendPredefined(ZydisFormatterBuffer *, const ZydisPredefinedToken *)"
                 );
  }
  if ((buffer->is_token_list != '\0') &&
     (ZVar8 = ZydisFormatterBufferAppend(buffer,'\x06'), (int)ZVar8 < 0)) {
    return ZVar8;
  }
  if (((context->instruction->meta).branch_type == ZYDIS_BRANCH_TYPE_FAR) &&
     (ZVar8 = ZydisStringAppendShortCase(&buffer->string,&STR_FAR_ATT,formatter->case_mnemonic),
     (int)ZVar8 < 0)) {
    return ZVar8;
  }
  ZVar8 = ZydisStringAppendShortCase(&buffer->string,pZVar10,formatter->case_mnemonic);
  if ((int)ZVar8 < 0) {
    return ZVar8;
  }
  if (context->instruction->operand_count_visible == '\0') {
    ZVar9 = 0;
  }
  else {
    lVar13 = 0;
    uVar11 = 0;
    ZVar9 = 0;
    do {
      pZVar4 = context->operands;
      bVar7 = true;
      if ((*(int *)((long)&pZVar4->type + lVar13) == 2) &&
         ((iVar2 = *(int *)((long)&pZVar4->field_10 + lVar13), iVar2 == 4 || (iVar2 == 1)))) {
        ZVar9 = ZydisFormatterHelperGetExplicitSize
                          (formatter,context,(ZydisDecodedOperand *)(&pZVar4->id + lVar13));
        bVar7 = false;
      }
      if (!bVar7) break;
      uVar11 = uVar11 + 1;
      lVar13 = lVar13 + 0x50;
    } while (uVar11 < context->instruction->operand_count_visible);
  }
  if ((int)ZVar9 < 0x40) {
    if (ZVar9 == 8) {
      if ((buffer->string).vector.allocator != (ZyanAllocator *)0x0) {
LAB_001102f3:
        __assert_fail("!destination->vector.allocator",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                      ,0xeb,
                      "ZyanStatus ZydisStringAppendShort(ZyanString *, const ZydisShortString *)");
      }
      ZVar5 = (buffer->string).vector.size;
      if (ZVar5 == 0) {
LAB_00110312:
        __assert_fail("destination->vector.size && source->size",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                      ,0xec,
                      "ZyanStatus ZydisStringAppendShort(ZyanString *, const ZydisShortString *)");
      }
      if ((buffer->string).vector.capacity < ZVar5 + 1) goto LAB_001101d8;
      *(undefined2 *)((long)(buffer->string).vector.data + (ZVar5 - 1)) = 0x62;
    }
    else if (ZVar9 == 0x10) {
      if ((buffer->string).vector.allocator != (ZyanAllocator *)0x0) goto LAB_001102f3;
      ZVar5 = (buffer->string).vector.size;
      if (ZVar5 == 0) goto LAB_00110312;
      if ((buffer->string).vector.capacity < ZVar5 + 1) goto LAB_001101d8;
      *(undefined2 *)((long)(buffer->string).vector.data + (ZVar5 - 1)) = 0x77;
    }
    else {
      if (ZVar9 != 0x20) goto LAB_001101d8;
      if ((buffer->string).vector.allocator != (ZyanAllocator *)0x0) goto LAB_001102f3;
      ZVar5 = (buffer->string).vector.size;
      if (ZVar5 == 0) goto LAB_00110312;
      if ((buffer->string).vector.capacity < ZVar5 + 1) goto LAB_001101d8;
      *(undefined2 *)((long)(buffer->string).vector.data + (ZVar5 - 1)) = 0x6c;
    }
  }
  else if ((int)ZVar9 < 0x100) {
    if (ZVar9 == 0x40) {
      if ((buffer->string).vector.allocator != (ZyanAllocator *)0x0) goto LAB_001102f3;
      ZVar5 = (buffer->string).vector.size;
      if (ZVar5 == 0) goto LAB_00110312;
      if ((buffer->string).vector.capacity < ZVar5 + 1) goto LAB_001101d8;
      *(undefined2 *)((long)(buffer->string).vector.data + (ZVar5 - 1)) = 0x71;
    }
    else {
      if (ZVar9 != 0x80) goto LAB_001101d8;
      if ((buffer->string).vector.allocator != (ZyanAllocator *)0x0) goto LAB_001102f3;
      ZVar5 = (buffer->string).vector.size;
      if (ZVar5 == 0) goto LAB_00110312;
      if ((buffer->string).vector.capacity < ZVar5 + 1) goto LAB_001101d8;
      *(undefined2 *)((long)(buffer->string).vector.data + (ZVar5 - 1)) = 0x78;
    }
  }
  else if (ZVar9 == 0x100) {
    if ((buffer->string).vector.allocator != (ZyanAllocator *)0x0) goto LAB_001102f3;
    ZVar5 = (buffer->string).vector.size;
    if (ZVar5 == 0) goto LAB_00110312;
    if ((buffer->string).vector.capacity < ZVar5 + 1) goto LAB_001101d8;
    *(undefined2 *)((long)(buffer->string).vector.data + (ZVar5 - 1)) = 0x79;
  }
  else {
    if (ZVar9 != 0x200) goto LAB_001101d8;
    if ((buffer->string).vector.allocator != (ZyanAllocator *)0x0) goto LAB_001102f3;
    ZVar5 = (buffer->string).vector.size;
    if (ZVar5 == 0) goto LAB_00110312;
    if ((buffer->string).vector.capacity < ZVar5 + 1) goto LAB_001101d8;
    *(undefined2 *)((long)(buffer->string).vector.data + (ZVar5 - 1)) = 0x7a;
  }
  ZVar5 = (buffer->string).vector.size;
  pvVar6 = (buffer->string).vector.data;
  (buffer->string).vector.size = ZVar5 + 1;
  if (*(char *)((long)pvVar6 + ZVar5) != '\0') {
    __assert_fail("*(char*)((ZyanU8*)(destination)->vector.data + (destination)->vector.size - 1) == \'\\0\'"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                  ,0xf7,"ZyanStatus ZydisStringAppendShort(ZyanString *, const ZydisShortString *)")
    ;
  }
LAB_001101d8:
  if ((formatter->print_branch_size != '\0') &&
     (ZVar3 = (context->instruction->meta).branch_type, ZVar3 != ZYDIS_BRANCH_TYPE_NONE)) {
    if (ZVar3 == ZYDIS_BRANCH_TYPE_NEAR) {
      letter_case = formatter->case_mnemonic;
      pZVar10 = &STR_NEAR;
    }
    else {
      if (ZVar3 != ZYDIS_BRANCH_TYPE_SHORT) {
        return 0x80100004;
      }
      letter_case = formatter->case_mnemonic;
      pZVar10 = &STR_SHORT;
    }
    ZVar8 = ZydisStringAppendShortCase(&buffer->string,pZVar10,letter_case);
    return ZVar8;
  }
  return 0x100000;
}

Assistant:

ZyanStatus ZydisFormatterATTPrintMnemonic(const ZydisFormatter* formatter,
    ZydisFormatterBuffer* buffer, ZydisFormatterContext* context)
{
    ZYAN_ASSERT(formatter);
    ZYAN_ASSERT(buffer);
    ZYAN_ASSERT(context);
    ZYAN_ASSERT(context->instruction);
    ZYAN_ASSERT(context->operands);

    const ZydisShortString* mnemonic = ZydisMnemonicGetStringWrapped(
        context->instruction->mnemonic);
    if (!mnemonic)
    {
        ZYDIS_BUFFER_APPEND_CASE(buffer, INVALID_MNEMONIC, formatter->case_mnemonic);
        return ZYAN_STATUS_SUCCESS;
    }

    ZYDIS_BUFFER_APPEND_TOKEN(buffer, ZYDIS_TOKEN_MNEMONIC);
    if (context->instruction->meta.branch_type == ZYDIS_BRANCH_TYPE_FAR)
    {
        ZYAN_CHECK(ZydisStringAppendShortCase(&buffer->string, &STR_FAR_ATT,
            formatter->case_mnemonic));
    }
    ZYAN_CHECK(ZydisStringAppendShortCase(&buffer->string, mnemonic, formatter->case_mnemonic));

    // Append operand-size suffix
    ZyanU32 size = 0;
    for (ZyanU8 i = 0; i < context->instruction->operand_count_visible; ++i)
    {
        const ZydisDecodedOperand* const operand = &context->operands[i];
        if ((operand->type == ZYDIS_OPERAND_TYPE_MEMORY) &&
            ((operand->mem.type == ZYDIS_MEMOP_TYPE_MEM) ||
             (operand->mem.type == ZYDIS_MEMOP_TYPE_VSIB)))
        {
            size = ZydisFormatterHelperGetExplicitSize(formatter, context, operand);
            break;
        }
    }

    switch (size)
    {
    case   8: ZydisStringAppendShort(&buffer->string, &STR_SIZE_8_ATT  ); break;
    case  16: ZydisStringAppendShort(&buffer->string, &STR_SIZE_16_ATT ); break;
    case  32: ZydisStringAppendShort(&buffer->string, &STR_SIZE_32_ATT ); break;
    case  64: ZydisStringAppendShort(&buffer->string, &STR_SIZE_64_ATT ); break;
    case 128: ZydisStringAppendShort(&buffer->string, &STR_SIZE_128_ATT); break;
    case 256: ZydisStringAppendShort(&buffer->string, &STR_SIZE_256_ATT); break;
    case 512: ZydisStringAppendShort(&buffer->string, &STR_SIZE_512_ATT); break;
    default:
        break;
    }

    if (formatter->print_branch_size)
    {
        switch (context->instruction->meta.branch_type)
        {
        case ZYDIS_BRANCH_TYPE_NONE:
            break;
        case ZYDIS_BRANCH_TYPE_SHORT:
            return ZydisStringAppendShortCase(&buffer->string, &STR_SHORT,
                formatter->case_mnemonic);
        case ZYDIS_BRANCH_TYPE_NEAR:
            return ZydisStringAppendShortCase(&buffer->string, &STR_NEAR,
                formatter->case_mnemonic);
        default:
            return ZYAN_STATUS_INVALID_ARGUMENT;
        }
    }

    return ZYAN_STATUS_SUCCESS;
}